

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu580.c
# Opt level: O1

MPP_RET hal_h264e_vepu580_status_check(HalVepu580RegSet *regs)

{
  MPP_RET MVar1;
  
  if ((((uint)(regs->reg_ctl).int_sta & 2) != 0) && (((byte)hal_h264e_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_h264e_vepu580","lkt_done finish","hal_h264e_vepu580_status_check");
  }
  if ((((uint)(regs->reg_ctl).int_sta & 1) != 0) && (((byte)hal_h264e_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_h264e_vepu580","enc_done finish","hal_h264e_vepu580_status_check");
  }
  if ((((uint)(regs->reg_ctl).int_sta & 8) != 0) && (((byte)hal_h264e_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_h264e_vepu580","enc_slice finsh","hal_h264e_vepu580_status_check");
  }
  if ((((uint)(regs->reg_ctl).int_sta & 4) != 0) && (((byte)hal_h264e_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_h264e_vepu580","safe clear finsh","hal_h264e_vepu580_status_check");
  }
  MVar1 = MPP_OK;
  if (((uint)(regs->reg_ctl).int_sta & 0x10) != 0) {
    _mpp_log_l(2,"hal_h264e_vepu580","bit stream overflow","hal_h264e_vepu580_status_check");
    MVar1 = MPP_NOK;
  }
  if (((uint)(regs->reg_ctl).int_sta & 0x20) != 0) {
    _mpp_log_l(2,"hal_h264e_vepu580","bus write full","hal_h264e_vepu580_status_check");
    MVar1 = MPP_NOK;
  }
  if (((uint)(regs->reg_ctl).int_sta & 0x40) != 0) {
    _mpp_log_l(2,"hal_h264e_vepu580","bus write error","hal_h264e_vepu580_status_check");
    MVar1 = MPP_NOK;
  }
  if (((uint)(regs->reg_ctl).int_sta & 0x80) != 0) {
    _mpp_log_l(2,"hal_h264e_vepu580","bus read error","hal_h264e_vepu580_status_check");
    MVar1 = MPP_NOK;
  }
  if (((regs->reg_ctl).int_sta.field_0x1 & 1) != 0) {
    _mpp_log_l(2,"hal_h264e_vepu580","wdg timeout","hal_h264e_vepu580_status_check");
    MVar1 = MPP_NOK;
  }
  return MVar1;
}

Assistant:

static MPP_RET hal_h264e_vepu580_status_check(HalVepu580RegSet *regs)
{
    MPP_RET ret = MPP_OK;

    if (regs->reg_ctl.int_sta.lkt_node_done_sta)
        hal_h264e_dbg_detail("lkt_done finish");

    if (regs->reg_ctl.int_sta.enc_done_sta)
        hal_h264e_dbg_detail("enc_done finish");

    if (regs->reg_ctl.int_sta.slc_done_sta)
        hal_h264e_dbg_detail("enc_slice finsh");

    if (regs->reg_ctl.int_sta.sclr_done_sta)
        hal_h264e_dbg_detail("safe clear finsh");

    if (regs->reg_ctl.int_sta.bsf_oflw_sta) {
        mpp_err_f("bit stream overflow");
        ret = MPP_NOK;
    }

    if (regs->reg_ctl.int_sta.brsp_otsd_sta) {
        mpp_err_f("bus write full");
        ret = MPP_NOK;
    }

    if (regs->reg_ctl.int_sta.wbus_err_sta) {
        mpp_err_f("bus write error");
        ret = MPP_NOK;
    }

    if (regs->reg_ctl.int_sta.rbus_err_sta) {
        mpp_err_f("bus read error");
        ret = MPP_NOK;
    }

    if (regs->reg_ctl.int_sta.wdg_sta) {
        ret = MPP_NOK;
        mpp_err_f("wdg timeout");
    }

    return ret;
}